

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XMLReader::XMLReader
          (XMLReader *this,XMLCh *pubId,XMLCh *sysId,BinInputStream *streamToAdopt,RefFrom from,
          Types type,Sources source,bool throwAtEnd,bool calculateSrcOfs,XMLSize_t lowWaterMark,
          XMLVersion version,MemoryManager *manager)

{
  short *psVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  Encodings theEncoding;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLCh *pXVar5;
  XMLCh *__dest;
  XMLByte *pXVar6;
  size_t sVar7;
  undefined4 extraout_var_01;
  
  pXVar5 = (XMLCh *)0x0;
  this->fCharIndex = 0;
  this->fCharsAvail = 0;
  this->fCurCol = 1;
  this->fCurLine = 1;
  this->fEncodingStr = (XMLCh *)0x0;
  this->fForcedEncoding = false;
  this->fNoMore = false;
  if (pubId != (XMLCh *)0x0) {
    sVar7 = 0;
    do {
      psVar1 = (short *)((long)pubId + sVar7);
      sVar7 = sVar7 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*manager->_vptr_MemoryManager[3])(manager,sVar7);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var,iVar4);
    memcpy(pXVar5,pubId,sVar7);
  }
  this->fPublicId = pXVar5;
  pXVar5 = (XMLCh *)0x0;
  this->fRawBufIndex = 0;
  this->fRawBytesAvail = 0;
  this->fLowWaterMark = lowWaterMark;
  this->fReaderNum = 0xffffffff;
  this->fRefFrom = from;
  this->fSentTrailingSpace = false;
  this->fSource = source;
  this->fSrcOfsBase = 0;
  this->fSrcOfsSupported = false;
  this->fCalculateSrcOfs = calculateSrcOfs;
  if (sysId != (XMLCh *)0x0) {
    sVar7 = 0;
    do {
      psVar1 = (short *)((long)sysId + sVar7);
      sVar7 = sVar7 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*manager->_vptr_MemoryManager[3])(manager,sVar7);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
    memcpy(pXVar5,sysId,sVar7);
  }
  this->fSystemId = pXVar5;
  this->fStream = streamToAdopt;
  this->fSwapped = false;
  this->fThrowAtEnd = throwAtEnd;
  this->fTranscoder = (XMLTranscoder *)0x0;
  this->fType = type;
  this->fMemoryManager = manager;
  this->fXMLVersion = version;
  pXVar6 = &XMLChar1_0::fgCharCharsTable1_0;
  uVar2 = XMLChar1_0::enableNEL;
  if (version == XMLV1_1) {
    pXVar6 = &XMLChar1_1::fgCharCharsTable1_1;
    uVar2 = true;
  }
  this->fNEL = (bool)uVar2;
  this->fgCharCharsTable = pXVar6;
  refreshRawBuffer(this);
  bVar3 = (bool)(**(code **)(*XMLPlatformUtils::fgTransService + 0x30))();
  this->fSrcOfsSupported = bVar3;
  theEncoding = XMLRecognizer::basicEncodingProbe(this->fRawByteBuf,this->fRawBytesAvail);
  this->fEncoding = theEncoding;
  pXVar5 = XMLRecognizer::nameForEncoding(theEncoding,this->fMemoryManager);
  if (pXVar5 == (XMLCh *)0x0) {
    __dest = (XMLCh *)0x0;
  }
  else {
    sVar7 = 0;
    do {
      psVar1 = (short *)((long)pXVar5 + sVar7);
      sVar7 = sVar7 + 2;
    } while (*psVar1 != 0);
    iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar7);
    __dest = (XMLCh *)CONCAT44(extraout_var_01,iVar4);
    memcpy(__dest,pXVar5,sVar7);
  }
  this->fEncodingStr = __dest;
  checkForSwapped(this);
  doInitDecode(this);
  return;
}

Assistant:

XMLReader::XMLReader(const  XMLCh* const          pubId
                    , const XMLCh* const          sysId
                    ,       BinInputStream* const streamToAdopt
                    , const RefFrom               from
                    , const Types                 type
                    , const Sources               source
                    , const bool                  throwAtEnd
                    , const bool                  calculateSrcOfs
                    ,       XMLSize_t             lowWaterMark
                    , const XMLVersion            version
                    ,       MemoryManager* const  manager) :
    fCharIndex(0)
    , fCharsAvail(0)
    , fCurCol(1)
    , fCurLine(1)
    , fEncodingStr(0)
    , fForcedEncoding(false)
    , fNoMore(false)
    , fPublicId(XMLString::replicate(pubId, manager))
    , fRawBufIndex(0)
    , fRawBytesAvail(0)
    , fLowWaterMark (lowWaterMark)
    , fReaderNum(0xFFFFFFFF)
    , fRefFrom(from)
    , fSentTrailingSpace(false)
    , fSource(source)
    , fSrcOfsBase(0)
    , fSrcOfsSupported(false)
    , fCalculateSrcOfs(calculateSrcOfs)
    , fSystemId(XMLString::replicate(sysId, manager))
    , fStream(streamToAdopt)
    , fSwapped(false)
    , fThrowAtEnd(throwAtEnd)
    , fTranscoder(0)
    , fType(type)
    , fMemoryManager(manager)
{
    setXMLVersion(version);

    try
    {
        // Do an initial load of raw bytes
        refreshRawBuffer();
    }
    catch (const XMLPlatformUtilsException&)
    {
        cleanup();
        throw;
    }

    // Ask the transcoding service if it supports src offset info
    fSrcOfsSupported = XMLPlatformUtils::fgTransService->supportsSrcOfs();

    //
    //  Use the recognizer class to get a basic sense of what family of
    //  encodings this file is in. We'll start off with a reader of that
    //  type, and update it later if needed when we read the XMLDecl line.
    //
    fEncoding = XMLRecognizer::basicEncodingProbe(fRawByteBuf, fRawBytesAvail);

    #if defined(XERCES_DEBUG)
    if ((fEncoding < XMLRecognizer::Encodings_Min)
    ||  (fEncoding > XMLRecognizer::Encodings_Max))
    {
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Reader_BadAutoEncoding, fMemoryManager);
    }
    #endif

    fEncodingStr = XMLString::replicate(XMLRecognizer::nameForEncoding(fEncoding, fMemoryManager), fMemoryManager);

    // Check whether the fSwapped flag should be set or not
    checkForSwapped();

    //
    //  This will check to see if the first line is an XMLDecl and, if
    //  so, decode that first line manually one character at a time. This
    //  leaves enough characters in the buffer that the high level code
    //  can get through the Decl and call us back with the real encoding.
    //
    doInitDecode();

    //
    //  NOTE: We won't create a transcoder until we either get a call to
    //  setEncoding() or we get a call to refreshCharBuffer() and no
    //  transcoder has been set yet.
    //
}